

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int FnNoise5_float(float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngood,
                  float *minval,float *maxval,double *noise2,double *noise3,double *noise5,
                  int *status)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  float *arr;
  float *arr_00;
  float *arr_01;
  double *__base;
  double *__base_00;
  double *__base_01;
  long lVar4;
  int in_ECX;
  size_t in_RDX;
  int n;
  size_t in_RSI;
  long in_RDI;
  long *in_R8;
  float *in_R9;
  float in_XMM0_Da;
  float fVar5;
  float *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  int *in_stack_00000028;
  double xnoise5;
  double xnoise3;
  double xnoise2;
  double *diffs5;
  double *diffs3;
  double *diffs2;
  int do_range;
  float xmaxval;
  float xminval;
  float v9;
  float v8;
  float v7;
  float v6;
  float v5;
  float v4;
  float v3;
  float v2;
  float v1;
  float *rowpix;
  float *differences5;
  float *differences3;
  float *differences2;
  long ngoodpix;
  long nvals2;
  long nvals;
  long nrows2;
  long nrows;
  long jj;
  long ii;
  double local_f0;
  double local_e8;
  double local_e0;
  float local_bc;
  float local_b8;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  long local_70;
  long local_68;
  long local_60;
  size_t local_58;
  size_t local_50;
  long local_48;
  size_t local_40;
  size_t local_20;
  size_t local_18;
  int local_4;
  
  local_50 = 0;
  local_58 = 0;
  local_70 = 0;
  local_b8 = 3.4028235e+38;
  local_bc = -3.4028235e+38;
  bVar2 = false;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((long)in_RSI < 9) {
    local_18 = in_RSI * in_RDX;
    local_20 = 1;
  }
  if ((long)local_18 < 9) {
    for (local_40 = 0; (long)local_40 < (long)local_18; local_40 = local_40 + 1) {
      if (((in_ECX == 0) || (fVar5 = *(float *)(in_RDI + local_40 * 4), fVar5 != in_XMM0_Da)) ||
         (NAN(fVar5) || NAN(in_XMM0_Da))) {
        if (*(float *)(in_RDI + local_40 * 4) < local_b8) {
          local_b8 = *(float *)(in_RDI + local_40 * 4);
        }
        if (local_bc < *(float *)(in_RDI + local_40 * 4)) {
          local_bc = *(float *)(in_RDI + local_40 * 4);
        }
        local_70 = local_70 + 1;
      }
    }
    if (in_R9 != (float *)0x0) {
      *in_R9 = local_b8;
    }
    if (in_stack_00000008 != (float *)0x0) {
      *in_stack_00000008 = local_bc;
    }
    if (in_R8 != (long *)0x0) {
      *in_R8 = local_70;
    }
    if (in_stack_00000010 != (double *)0x0) {
      *in_stack_00000010 = 0.0;
    }
    if (in_stack_00000018 != (double *)0x0) {
      *in_stack_00000018 = 0.0;
    }
    if (in_stack_00000020 != (double *)0x0) {
      *in_stack_00000020 = 0.0;
    }
    local_4 = *in_stack_00000028;
  }
  else {
    if ((in_R9 != (float *)0x0) || (in_stack_00000008 != (float *)0x0)) {
      bVar2 = true;
    }
    arr = (float *)calloc(local_18,4);
    if (arr == (float *)0x0) {
      *in_stack_00000028 = 0x71;
      local_4 = *in_stack_00000028;
    }
    else {
      arr_00 = (float *)calloc(local_18,4);
      if (arr_00 == (float *)0x0) {
        free(arr);
        *in_stack_00000028 = 0x71;
        local_4 = *in_stack_00000028;
      }
      else {
        arr_01 = (float *)calloc(local_18,4);
        if (arr_01 == (float *)0x0) {
          free(arr);
          free(arr_00);
          *in_stack_00000028 = 0x71;
          local_4 = *in_stack_00000028;
        }
        else {
          __base = (double *)calloc(local_20,8);
          if (__base == (double *)0x0) {
            free(arr);
            free(arr_00);
            free(arr_01);
            *in_stack_00000028 = 0x71;
            local_4 = *in_stack_00000028;
          }
          else {
            __base_00 = (double *)calloc(local_20,8);
            if (__base_00 == (double *)0x0) {
              free(arr);
              free(arr_00);
              free(arr_01);
              free(__base);
              *in_stack_00000028 = 0x71;
              local_4 = *in_stack_00000028;
            }
            else {
              __base_01 = (double *)calloc(local_20,8);
              if (__base_01 == (double *)0x0) {
                free(arr);
                free(arr_00);
                free(arr_01);
                free(__base);
                free(__base_00);
                *in_stack_00000028 = 0x71;
                local_4 = *in_stack_00000028;
              }
              else {
                for (local_48 = 0; local_48 < (long)local_20; local_48 = local_48 + 1) {
                  lVar4 = in_RDI + local_48 * local_18 * 4;
                  local_40 = 0;
                  if (in_ECX != 0) {
                    while( true ) {
                      bVar1 = false;
                      if ((long)local_40 < (long)local_18) {
                        bVar1 = *(float *)(lVar4 + local_40 * 4) == in_XMM0_Da;
                      }
                      if (!bVar1) break;
                      local_40 = local_40 + 1;
                    }
                  }
                  lVar3 = local_70;
                  if (local_40 != local_18) {
                    local_94 = *(float *)(lVar4 + local_40 * 4);
                    if (bVar2) {
                      if (local_94 < local_b8) {
                        local_b8 = local_94;
                      }
                      if (local_bc < local_94) {
                        local_bc = local_94;
                      }
                    }
                    local_40 = local_40 + 1;
                    if (in_ECX != 0) {
                      while( true ) {
                        bVar1 = false;
                        if ((long)local_40 < (long)local_18) {
                          bVar1 = *(float *)(lVar4 + local_40 * 4) == in_XMM0_Da;
                        }
                        if (!bVar1) break;
                        local_40 = local_40 + 1;
                      }
                    }
                    lVar3 = local_70 + 1;
                    if (local_40 != local_18) {
                      local_98 = *(float *)(lVar4 + local_40 * 4);
                      if (bVar2) {
                        if (local_98 < local_b8) {
                          local_b8 = local_98;
                        }
                        if (local_bc < local_98) {
                          local_bc = local_98;
                        }
                      }
                      local_40 = local_40 + 1;
                      if (in_ECX != 0) {
                        while( true ) {
                          bVar1 = false;
                          if ((long)local_40 < (long)local_18) {
                            bVar1 = *(float *)(lVar4 + local_40 * 4) == in_XMM0_Da;
                          }
                          if (!bVar1) break;
                          local_40 = local_40 + 1;
                        }
                      }
                      lVar3 = local_70 + 2;
                      if (local_40 != local_18) {
                        local_9c = *(float *)(lVar4 + local_40 * 4);
                        if (bVar2) {
                          if (local_9c < local_b8) {
                            local_b8 = local_9c;
                          }
                          if (local_bc < local_9c) {
                            local_bc = local_9c;
                          }
                        }
                        local_40 = local_40 + 1;
                        if (in_ECX != 0) {
                          while( true ) {
                            bVar1 = false;
                            if ((long)local_40 < (long)local_18) {
                              bVar1 = *(float *)(lVar4 + local_40 * 4) == in_XMM0_Da;
                            }
                            if (!bVar1) break;
                            local_40 = local_40 + 1;
                          }
                        }
                        lVar3 = local_70 + 3;
                        if (local_40 != local_18) {
                          local_a0 = *(float *)(lVar4 + local_40 * 4);
                          if (bVar2) {
                            if (local_a0 < local_b8) {
                              local_b8 = local_a0;
                            }
                            if (local_bc < local_a0) {
                              local_bc = local_a0;
                            }
                          }
                          local_40 = local_40 + 1;
                          if (in_ECX != 0) {
                            while( true ) {
                              bVar1 = false;
                              if ((long)local_40 < (long)local_18) {
                                bVar1 = *(float *)(lVar4 + local_40 * 4) == in_XMM0_Da;
                              }
                              if (!bVar1) break;
                              local_40 = local_40 + 1;
                            }
                          }
                          lVar3 = local_70 + 4;
                          if (local_40 != local_18) {
                            local_a4 = *(float *)(lVar4 + local_40 * 4);
                            if (bVar2) {
                              if (local_a4 < local_b8) {
                                local_b8 = local_a4;
                              }
                              if (local_bc < local_a4) {
                                local_bc = local_a4;
                              }
                            }
                            local_40 = local_40 + 1;
                            if (in_ECX != 0) {
                              while( true ) {
                                bVar1 = false;
                                if ((long)local_40 < (long)local_18) {
                                  bVar1 = *(float *)(lVar4 + local_40 * 4) == in_XMM0_Da;
                                }
                                if (!bVar1) break;
                                local_40 = local_40 + 1;
                              }
                            }
                            lVar3 = local_70 + 5;
                            if (local_40 != local_18) {
                              local_a8 = *(float *)(lVar4 + local_40 * 4);
                              if (bVar2) {
                                if (local_a8 < local_b8) {
                                  local_b8 = local_a8;
                                }
                                if (local_bc < local_a8) {
                                  local_bc = local_a8;
                                }
                              }
                              local_40 = local_40 + 1;
                              if (in_ECX != 0) {
                                while( true ) {
                                  bVar1 = false;
                                  if ((long)local_40 < (long)local_18) {
                                    bVar1 = *(float *)(lVar4 + local_40 * 4) == in_XMM0_Da;
                                  }
                                  if (!bVar1) break;
                                  local_40 = local_40 + 1;
                                }
                              }
                              lVar3 = local_70 + 6;
                              if (local_40 != local_18) {
                                local_ac = *(float *)(lVar4 + local_40 * 4);
                                if (bVar2) {
                                  if (local_ac < local_b8) {
                                    local_b8 = local_ac;
                                  }
                                  if (local_bc < local_ac) {
                                    local_bc = local_ac;
                                  }
                                }
                                local_40 = local_40 + 1;
                                if (in_ECX != 0) {
                                  while( true ) {
                                    bVar1 = false;
                                    if ((long)local_40 < (long)local_18) {
                                      bVar1 = *(float *)(lVar4 + local_40 * 4) == in_XMM0_Da;
                                    }
                                    if (!bVar1) break;
                                    local_40 = local_40 + 1;
                                  }
                                }
                                lVar3 = local_70 + 7;
                                if (local_40 != local_18) {
                                  local_b0 = *(float *)(lVar4 + local_40 * 4);
                                  local_70 = local_70 + 8;
                                  if (bVar2) {
                                    if (local_b0 < local_b8) {
                                      local_b8 = local_b0;
                                    }
                                    if (local_bc < local_b0) {
                                      local_bc = local_b0;
                                    }
                                  }
                                  local_60 = 0;
                                  local_68 = 0;
                                  while (local_40 = local_40 + 1, (long)local_40 < (long)local_18) {
                                    if (in_ECX != 0) {
                                      while( true ) {
                                        bVar1 = false;
                                        if ((long)local_40 < (long)local_18) {
                                          bVar1 = *(float *)(lVar4 + local_40 * 4) == in_XMM0_Da;
                                        }
                                        if (!bVar1) break;
                                        local_40 = local_40 + 1;
                                      }
                                    }
                                    if (local_40 == local_18) break;
                                    fVar5 = *(float *)(lVar4 + local_40 * 4);
                                    if (bVar2) {
                                      if (fVar5 < local_b8) {
                                        local_b8 = fVar5;
                                      }
                                      if (local_bc < fVar5) {
                                        local_bc = fVar5;
                                      }
                                    }
                                    if (((local_a4 != local_a8) || (local_a8 != local_ac)) ||
                                       (NAN(local_a8) || NAN(local_ac))) {
                                      arr[local_68] =
                                           (float)(double)((ulong)(double)(local_a4 - local_ac) &
                                                          (ulong)DAT_0026c3a0);
                                      local_68 = local_68 + 1;
                                    }
                                    if (((local_9c != local_a0) || (local_a0 != local_a4)) ||
                                       ((local_a4 != local_a8 ||
                                        ((local_a8 != local_ac || (NAN(local_a8) || NAN(local_ac))))
                                        ))) {
                                      arr_00[local_60] =
                                           ABS((local_a4 + local_a4 + -local_9c) - local_ac);
                                      arr_01[local_60] =
                                           (float)(double)((ulong)(double)(local_ac * -4.0 +
                                                                           local_a4 * 6.0 +
                                                                           -(local_9c * 4.0) +
                                                                           local_94 + fVar5) &
                                                          (ulong)DAT_0026c3a0);
                                      local_60 = local_60 + 1;
                                    }
                                    else {
                                      local_70 = local_70 + 1;
                                    }
                                    local_94 = local_98;
                                    local_98 = local_9c;
                                    local_9c = local_a0;
                                    local_a0 = local_a4;
                                    local_a4 = local_a8;
                                    local_a8 = local_ac;
                                    local_ac = local_b0;
                                    local_b0 = fVar5;
                                  }
                                  lVar3 = local_60 + local_70;
                                  if (local_60 != 0) {
                                    if (local_60 == 1) {
                                      if (local_68 == 1) {
                                        __base[local_58] = (double)*arr;
                                        local_58 = local_58 + 1;
                                      }
                                      __base_00[local_50] = (double)*arr_00;
                                      __base_01[local_50] = (double)*arr_01;
                                    }
                                    else {
                                      n = (int)local_60;
                                      if (1 < local_68) {
                                        fVar5 = quick_select_float(arr,n);
                                        __base[local_58] = (double)fVar5;
                                        local_58 = local_58 + 1;
                                      }
                                      fVar5 = quick_select_float(arr_00,n);
                                      __base_00[local_50] = (double)fVar5;
                                      fVar5 = quick_select_float(arr_01,n);
                                      __base_01[local_50] = (double)fVar5;
                                    }
                                    local_50 = local_50 + 1;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  local_70 = lVar3;
                }
                if (local_50 == 0) {
                  local_e8 = 0.0;
                  local_f0 = 0.0;
                }
                else if (local_50 == 1) {
                  local_e8 = *__base_00;
                  local_f0 = *__base_01;
                }
                else {
                  qsort(__base_00,local_50,8,FnCompare_double);
                  qsort(__base_01,local_50,8,FnCompare_double);
                  local_e8 = (__base_00[(long)(local_50 - 1) / 2] + __base_00[(long)local_50 / 2]) /
                             2.0;
                  local_f0 = (__base_01[(long)(local_50 - 1) / 2] + __base_01[(long)local_50 / 2]) /
                             2.0;
                }
                if (local_58 == 0) {
                  local_e0 = 0.0;
                }
                else if (local_58 == 1) {
                  local_e0 = *__base;
                }
                else {
                  qsort(__base,local_58,8,FnCompare_double);
                  local_e0 = (__base[(long)(local_58 - 1) / 2] + __base[(long)local_58 / 2]) / 2.0;
                }
                if (in_R8 != (long *)0x0) {
                  *in_R8 = local_70;
                }
                if (in_R9 != (float *)0x0) {
                  *in_R9 = local_b8;
                }
                if (in_stack_00000008 != (float *)0x0) {
                  *in_stack_00000008 = local_bc;
                }
                if (in_stack_00000010 != (double *)0x0) {
                  *in_stack_00000010 = local_e0 * 1.0483579;
                }
                if (in_stack_00000018 != (double *)0x0) {
                  *in_stack_00000018 = local_e8 * 0.6052697;
                }
                if (in_stack_00000020 != (double *)0x0) {
                  *in_stack_00000020 = local_f0 * 0.1772048;
                }
                free(__base_01);
                free(__base_00);
                free(__base);
                free(arr_01);
                free(arr_00);
                free(arr);
                local_4 = *in_stack_00000028;
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int FnNoise5_float
       (float *array,       /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
        long ny,            /* number of rows in the image */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */
   /* returned parameters */   
	long *ngood,        /* number of good, non-null pixels? */
	float *minval,    /* minimum non-null value */
	float *maxval,    /* maximum non-null value */
	double *noise2,      /* returned 2nd order MAD of all non-null pixels */
	double *noise3,      /* returned 3rd order MAD of all non-null pixels */
	double *noise5,      /* returned 5th order MAD of all non-null pixels */
	int *status)        /* error status */

/*
Estimate the median and background noise in the input image using 2nd, 3rd and 5th
order Median Absolute Differences.

The noise in the background of the image is calculated using the MAD algorithms 
developed for deriving the signal to noise ratio in spectra
(see issue #42 of the ST-ECF newsletter, http://www.stecf.org/documents/newsletter/)

3rd order:  noise = 1.482602 / sqrt(6) * median (abs(2*flux(i) - flux(i-2) - flux(i+2)))

The returned estimates are the median of the values that are computed for each 
row of the image.
*/
{
	long ii, jj, nrows = 0, nrows2 = 0, nvals, nvals2, ngoodpix = 0;
	float *differences2, *differences3, *differences5;
	float *rowpix, v1, v2, v3, v4, v5, v6, v7, v8, v9;
	float xminval = FLT_MAX, xmaxval = -FLT_MAX;
	int do_range = 0;
	double *diffs2, *diffs3, *diffs5; 
	double xnoise2 = 0, xnoise3 = 0, xnoise5 = 0;
	
	if (nx < 9) {
		/* treat entire array as an image with a single row */
		nx = nx * ny;
		ny = 1;
	}

	/* rows must have at least 9 pixels */
	if (nx < 9) {

		for (ii = 0; ii < nx; ii++) {
		    if (nullcheck && array[ii] == nullvalue)
		        continue;
		    else {
			if (array[ii] < xminval) xminval = array[ii];
			if (array[ii] > xmaxval) xmaxval = array[ii];
			ngoodpix++;
		    }
		}
		if (minval) *minval = xminval;
		if (maxval) *maxval = xmaxval;
		if (ngood) *ngood = ngoodpix;
		if (noise2) *noise2 = 0.;
		if (noise3) *noise3 = 0.;
		if (noise5) *noise5 = 0.;
		return(*status);
	}

	/* do we need to compute the min and max value? */
	if (minval || maxval) do_range = 1;
	
        /* allocate arrays used to compute the median and noise estimates */
	differences2 = calloc(nx, sizeof(float));
	if (!differences2) {
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}
	differences3 = calloc(nx, sizeof(float));
	if (!differences3) {
		free(differences2);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}
	differences5 = calloc(nx, sizeof(float));
	if (!differences5) {
		free(differences2);
		free(differences3);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs2 = calloc(ny, sizeof(double));
	if (!diffs2) {
		free(differences2);
		free(differences3);
		free(differences5);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs3 = calloc(ny, sizeof(double));
	if (!diffs3) {
		free(differences2);
		free(differences3);
		free(differences5);
		free(diffs2);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs5 = calloc(ny, sizeof(double));
	if (!diffs5) {
		free(differences2);
		free(differences3);
		free(differences5);
		free(diffs2);
		free(diffs3);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* loop over each row of the image */
	for (jj=0; jj < ny; jj++) {

                rowpix = array + (jj * nx); /* point to first pixel in the row */

		/***** find the first valid pixel in row */
		ii = 0;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v1 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v1 < xminval) xminval = v1;
			if (v1 > xmaxval) xmaxval = v1;
		}

		/***** find the 2nd valid pixel in row (which we will skip over) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v2 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;
		
		if (do_range) {
			if (v2 < xminval) xminval = v2;
			if (v2 > xmaxval) xmaxval = v2;
		}

		/***** find the 3rd valid pixel in row */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v3 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v3 < xminval) xminval = v3;
			if (v3 > xmaxval) xmaxval = v3;
		}
				
		/* find the 4nd valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v4 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v4 < xminval) xminval = v4;
			if (v4 > xmaxval) xmaxval = v4;
		}
			
		/* find the 5th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v5 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v5 < xminval) xminval = v5;
			if (v5 > xmaxval) xmaxval = v5;
		}
				
		/* find the 6th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v6 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v6 < xminval) xminval = v6;
			if (v6 > xmaxval) xmaxval = v6;
		}
				
		/* find the 7th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v7 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v7 < xminval) xminval = v7;
			if (v7 > xmaxval) xmaxval = v7;
		}
				
		/* find the 8th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v8 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v8 < xminval) xminval = v8;
			if (v8 > xmaxval) xmaxval = v8;
		}
		/* now populate the differences arrays */
		/* for the remaining pixels in the row */
		nvals = 0;
		nvals2 = 0;
		for (ii++; ii < nx; ii++) {

		    /* find the next valid pixel in row */
                    if (nullcheck)
		        while (ii < nx && rowpix[ii] == nullvalue) ii++;
		     
		    if (ii == nx) break;  /* hit end of row */
		    v9 = rowpix[ii];  /* store the good pixel value */

		    if (do_range) {
			if (v9 < xminval) xminval = v9;
			if (v9 > xmaxval) xmaxval = v9;
		    }

		    /* construct array of absolute differences */

		    if (!(v5 == v6 && v6 == v7) ) {
		        differences2[nvals2] = (float) fabs(v5 - v7);
			nvals2++;
		    }

		    if (!(v3 == v4 && v4 == v5 && v5 == v6 && v6 == v7) ) {
		        differences3[nvals] = (float) fabs((2 * v5) - v3 - v7);
		        differences5[nvals] = (float) fabs((6 * v5) - (4 * v3) - (4 * v7) + v1 + v9);
		        nvals++;  
		    } else {
		        /* ignore constant background regions */
			ngoodpix++;
		    }

		    /* shift over 1 pixel */
		    v1 = v2;
		    v2 = v3;
		    v3 = v4;
		    v4 = v5;
		    v5 = v6;
		    v6 = v7;
		    v7 = v8;
		    v8 = v9;
	        }  /* end of loop over pixels in the row */

		/* compute the median diffs */
		/* Note that there are 8 more pixel values than there are diffs values. */
		ngoodpix += nvals;

		if (nvals == 0) {
		    continue;  /* cannot compute medians on this row */
		} else if (nvals == 1) {
		    if (nvals2 == 1) {
		        diffs2[nrows2] = differences2[0];
			nrows2++;
		    }
		        
		    diffs3[nrows] = differences3[0];
		    diffs5[nrows] = differences5[0];
		} else {
                    /* quick_select returns the median MUCH faster than using qsort */
		    if (nvals2 > 1) {
                        diffs2[nrows2] = quick_select_float(differences2, nvals);
			nrows2++;
		    }

                    diffs3[nrows] = quick_select_float(differences3, nvals);
                    diffs5[nrows] = quick_select_float(differences5, nvals);
		}

		nrows++;
	}  /* end of loop over rows */

	    /* compute median of the values for each row */
	if (nrows == 0) { 
	       xnoise3 = 0;
	       xnoise5 = 0;
	} else if (nrows == 1) {
	       xnoise3 = diffs3[0];
	       xnoise5 = diffs5[0];
	} else {	    
	       qsort(diffs3, nrows, sizeof(double), FnCompare_double);
	       qsort(diffs5, nrows, sizeof(double), FnCompare_double);
	       xnoise3 =  (diffs3[(nrows - 1)/2] + diffs3[nrows/2]) / 2.;
	       xnoise5 =  (diffs5[(nrows - 1)/2] + diffs5[nrows/2]) / 2.;
	}

	if (nrows2 == 0) { 
	       xnoise2 = 0;
	} else if (nrows2 == 1) {
	       xnoise2 = diffs2[0];
	} else {	    
	       qsort(diffs2, nrows2, sizeof(double), FnCompare_double);
	       xnoise2 =  (diffs2[(nrows2 - 1)/2] + diffs2[nrows2/2]) / 2.;
	}

	if (ngood)  *ngood  = ngoodpix;
	if (minval) *minval = xminval;
	if (maxval) *maxval = xmaxval;
	if (noise2)  *noise2  = 1.0483579 * xnoise2;
	if (noise3)  *noise3  = 0.6052697 * xnoise3;
	if (noise5)  *noise5  = 0.1772048 * xnoise5;

	free(diffs5);
	free(diffs3);
	free(diffs2);
	free(differences5);
	free(differences3);
	free(differences2);

	return(*status);
}